

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t
flatcc_builder_create_vector
          (flatcc_builder_t *B,void *data,size_t count,size_t elem_size,uint16_t align,
          size_t max_count)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  flatbuffers_uoffset_t length_prefix;
  int local_a4;
  size_t local_a0;
  int local_98;
  flatcc_iovec_t local_90;
  void *local_80;
  ulong local_78;
  
  if (max_count < count) {
    __assert_fail("count <= max_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x572,
                  "flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *, const void *, size_t, size_t, uint16_t, size_t)"
                 );
  }
  uVar1 = 4;
  if (4 < align) {
    uVar1 = align;
  }
  if (B->min_align < uVar1) {
    B->min_align = uVar1;
  }
  local_a4 = (int)count;
  uVar3 = (int)elem_size * local_a4;
  local_90.iov_base = &local_a4;
  iVar5 = B->emit_start;
  uVar2 = uVar1 - 1 & iVar5 - uVar3;
  local_a0 = 4;
  local_90.iov_len = 4;
  local_98 = 1;
  if (uVar3 == 0) {
    iVar4 = 1;
  }
  else {
    local_78 = (ulong)uVar3;
    local_a0 = local_78 + 4;
    local_98 = 2;
    iVar4 = 2;
    local_80 = data;
  }
  if (uVar2 != 0) {
    local_a0 = local_a0 + uVar2;
    *(uint8_t **)((long)&local_90.iov_base + (ulong)(uint)(iVar4 << 4)) = "";
    *(ulong *)((long)&local_90.iov_len + (ulong)(uint)(iVar4 << 4)) = (ulong)uVar2;
    iVar4 = iVar4 + 1;
    local_98 = iVar4;
  }
  if (((uint)(local_a0 >> 4) < 0x10000001) && (0 < (int)local_a0)) {
    iVar5 = iVar5 - (int)local_a0;
    iVar4 = (*B->emit)(B->emit_context,&local_90,iVar4,iVar5,local_a0);
    if (iVar4 == 0) {
      B->emit_start = iVar5;
      return iVar5;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x299,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *B,
        const void *data, size_t count, size_t elem_size, uint16_t align, size_t max_count)
{
    /*
     * Note: it is important that vec_size is uoffset not size_t
     * in case sizeof(uoffset_t) > sizeof(size_t) because max_count is
     * defined in terms of uoffset_t representation size, and also
     * because we risk accepting too large a vector even if max_count is
     * not violated.
     */
    uoffset_t vec_size, vec_pad, length_prefix;
    iov_state_t iov;

    check_error(count <= max_count, 0, "vector max_count violated");
    get_min_align(&align, field_size);
    set_min_align(B, align);
    vec_size = (uoffset_t)count * (uoffset_t)elem_size;
    /*
     * That can happen on 32 bit systems when uoffset_t is defined as 64-bit.
     * `emit_front/back` captures overflow, but not if our size type wraps first.
     */
#if FLATBUFFERS_UOFFSET_MAX > SIZE_MAX
    check_error(vec_size < SIZE_MAX, 0, "vector larger than address space");
#endif
    write_uoffset(&length_prefix, (uoffset_t)count);
    /* Alignment is calculated for the first element, not the header. */
    vec_pad = front_pad(B, vec_size, align);
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(data, vec_size);
    push_iov(_pad, vec_pad);
    return emit_front(B, &iov);
}